

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O2

istream * utility::read<std::vector<long,std::allocator<long>>>
                    (istream *stream,vector<long,_std::allocator<long>_> *values)

{
  pointer plVar1;
  long *plVar2;
  long *value;
  pointer plVar3;
  int64_t n;
  size_t size;
  
  size = 0;
  plVar2 = (long *)std::istream::read((char *)stream,(long)&size);
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
    std::vector<long,_std::allocator<long>_>::resize(values,size);
    plVar1 = (values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (plVar3 = (values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_start; plVar3 != plVar1; plVar3 = plVar3 + 1) {
      n = 0;
      std::istream::read((char *)stream,(long)&n);
      *plVar3 = n;
    }
  }
  return stream;
}

Assistant:

std::istream & read (std::istream & stream, Container & values)
    {
        auto size = std::size_t{};
        if (burst::trivial_read(stream, size))
        {
            values.resize(size);

            for (auto & value: values)
            {
                auto n = std::int64_t{};
                burst::trivial_read(stream, n);
                value = static_cast<typename Container::value_type>(n);
            }
        }

        return stream;
    }